

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void bitset_container_printf_as_uint32_array(bitset_container_t *v,uint32_t base)

{
  long lVar1;
  bool bVar2;
  char *__format;
  uint64_t uVar3;
  int i;
  long lVar4;
  
  bVar2 = true;
  lVar4 = 0;
  do {
    uVar3 = v->words[lVar4];
    if (uVar3 != 0) {
      __format = ",%u";
      if (bVar2) {
        __format = "%u";
      }
      do {
        lVar1 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        bVar2 = false;
        printf(__format,(ulong)((int)lVar1 + base));
        uVar3 = uVar3 & uVar3 - 1;
        __format = ",%u";
      } while (uVar3 != 0);
    }
    base = base + 0x40;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x400);
  return;
}

Assistant:

void bitset_container_printf_as_uint32_array(const bitset_container_t * v, uint32_t base) {
	bool iamfirst = true;// TODO: rework so that this is not necessary yet still readable
	for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i) {
		uint64_t w = v->words[i];
		while (w != 0) {
			uint64_t t = w & (~w + 1);
			int r = __builtin_ctzll(w);
			if(iamfirst) {// predicted to be false
				printf("%u", r + base);
				iamfirst = false;
			} else {
				printf(",%u",r + base);
			}
			w ^= t;
		}
		base += 64;
	}
}